

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

target_ulong_conflict helper_mftc0_configx_mips(CPUMIPSState *env,target_ulong_conflict idx)

{
  CPUMIPSState *pCVar1;
  CPUMIPSState *other;
  int other_tc;
  target_ulong_conflict idx_local;
  CPUMIPSState *env_local;
  
  other._0_4_ = (uint)(byte)env->CP0_VPEControl;
  other._4_4_ = idx;
  _other_tc = env;
  pCVar1 = mips_cpu_map_tc(env,(int *)&other);
  switch(other._4_4_) {
  case 0:
    env_local._4_4_ = pCVar1->CP0_Config0;
    break;
  case 1:
    env_local._4_4_ = pCVar1->CP0_Config1;
    break;
  case 2:
    env_local._4_4_ = pCVar1->CP0_Config2;
    break;
  case 3:
    env_local._4_4_ = pCVar1->CP0_Config3;
    break;
  default:
    env_local._4_4_ = 0;
    break;
  case 6:
    env_local._4_4_ = pCVar1->CP0_Config6;
    break;
  case 7:
    env_local._4_4_ = pCVar1->CP0_Config7;
  }
  return env_local._4_4_;
}

Assistant:

target_ulong helper_mftc0_configx(CPUMIPSState *env, target_ulong idx)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    switch (idx) {
    case 0: return other->CP0_Config0;
    case 1: return other->CP0_Config1;
    case 2: return other->CP0_Config2;
    case 3: return other->CP0_Config3;
    /* 4 and 5 are reserved.  */
    case 6: return other->CP0_Config6;
    case 7: return other->CP0_Config7;
    default:
        break;
    }
    return 0;
}